

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O3

TCPConnection * __thiscall
ProtocolTCP::NewClient
          (ProtocolTCP *this,InterfaceMAC *mac,uint8_t *remoteAddress,uint16_t remotePort,
          uint16_t localPort)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint8_t *puVar5;
  
  lVar2 = 0;
  lVar3 = 0;
  do {
    if (*(int *)(&this->field_0x0 + lVar2) == 0) {
      TCPConnection::Allocate((TCPConnection *)((long)this - lVar3),mac);
      *(uint16_t *)(&this->field_0x4 + lVar2) = localPort;
      *(undefined4 *)(&this->field_0xc + lVar2) = 1;
      *(undefined4 *)(&this->field_0x18 + lVar2) = 0x401;
      sVar1 = ProtocolIPv4::AddressSize(this->IP);
      if (sVar1 != 0) {
        puVar5 = (uint8_t *)((long)this + (8 - lVar3));
        uVar4 = 0;
        do {
          *puVar5 = remoteAddress[uVar4];
          uVar4 = uVar4 + 1;
          sVar1 = ProtocolIPv4::AddressSize(this->IP);
          puVar5 = puVar5 + 1;
        } while (uVar4 < sVar1);
      }
      *(uint16_t *)(&this->field_0x6 + lVar2) = remotePort;
      return (TCPConnection *)((long)this - lVar3);
    }
    lVar3 = lVar3 + -0x370;
    lVar2 = lVar2 + 0x370;
  } while (lVar3 != -0x1130);
  return (TCPConnection *)0x0;
}

Assistant:

TCPConnection* ProtocolTCP::NewClient(InterfaceMAC* mac,
                                      const uint8_t* remoteAddress,
                                      uint16_t remotePort,
                                      uint16_t localPort)
{
    size_t i;
    size_t j;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        TCPConnection& connection = ConnectionList[i];
        if (connection.State == TCPConnection::CLOSED)
        {
            connection.Allocate(mac);
            connection.LocalPort = localPort;
            connection.SequenceNumber = 1;
            connection.MaxSequenceTx = connection.SequenceNumber + 1024;
            for (j = 0; j < IP.AddressSize(); j++)
            {
                connection.RemoteAddress[j] = remoteAddress[j];
            }
            connection.RemotePort = remotePort;

            return &connection;
        }
    }

    return nullptr;
}